

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3Module.cpp
# Opt level: O0

WasmString * __thiscall
w3Module::read_string(WasmString *__return_storage_ptr__,w3Module *this,uint8_t **cursor)

{
  int iVar1;
  allocator<char> local_49;
  string local_48;
  uint32_t local_24;
  uint8_t **ppuStack_20;
  uint32_t size;
  uint8_t **cursor_local;
  w3Module *this_local;
  WasmString *a;
  
  ppuStack_20 = cursor;
  cursor_local = (uint8_t **)this;
  this_local = (w3Module *)__return_storage_ptr__;
  local_24 = read_varuint32(this,cursor);
  if (this->end < *ppuStack_20 + local_24) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"malformed in read_string",&local_49);
    ThrowString(&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
  }
  WasmString::WasmString(__return_storage_ptr__);
  __return_storage_ptr__->data = (PCH)*ppuStack_20;
  __return_storage_ptr__->size = (ulong)local_24;
  if (local_24 < 0x80000000) {
    printf("read_string %X:%.*s\n",(ulong)local_24,(ulong)local_24,*ppuStack_20);
  }
  if ((local_24 == 7) && (iVar1 = memcmp(*ppuStack_20,"$_start",7), iVar1 == 0)) {
    __return_storage_ptr__->builtin = w3BuiltinString_start;
  }
  else if ((local_24 == 5) && (iVar1 = memcmp(*ppuStack_20,"_main",5), iVar1 == 0)) {
    __return_storage_ptr__->builtin = w3BuiltinString_main;
  }
  *ppuStack_20 = *ppuStack_20 + local_24;
  return __return_storage_ptr__;
}

Assistant:

WasmString w3Module::read_string (uint8_t** cursor)
{
    const uint32_t size = read_varuint32 (cursor);
    if (size + *cursor > end)
        ThrowString ("malformed in read_string");
    // TODO UTF8 handling
    WasmString a;
    a.data = (PCH)*cursor;
    a.size = size;

    // TODO string recognizer?
    if (size <= INT_MAX)
        printf ("read_string %X:%.*s\n", size, (int)size, *cursor);
    if (size == 7 && !memcmp (*cursor, "$_start", 7))
    {
        a.builtin = w3BuiltinString_start;
    }
    else if (size == 5 && !memcmp (*cursor, "_main", 5))
    {
        a.builtin = w3BuiltinString_main;
    }
    *cursor += size;
    return a;
}